

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RepulsivePowerInteractionType.hpp
# Opt level: O2

void __thiscall
OpenMD::RepulsivePowerInteractionType::RepulsivePowerInteractionType
          (RepulsivePowerInteractionType *this,RealType mySigma,RealType myEpsilon,int myNrep)

{
  NonBondedInteractionType::NonBondedInteractionType(&this->super_NonBondedInteractionType);
  (this->super_NonBondedInteractionType)._vptr_NonBondedInteractionType =
       (_func_int **)&PTR__NonBondedInteractionType_002c6880;
  this->sigma = mySigma;
  this->epsilon = myEpsilon;
  this->nRep = myNrep;
  NonBondedInteractionType::setRepulsivePower(&this->super_NonBondedInteractionType);
  return;
}

Assistant:

RepulsivePowerInteractionType(RealType mySigma, RealType myEpsilon,
                                  int myNrep) {
      sigma   = mySigma;
      epsilon = myEpsilon;
      nRep    = myNrep;
      setRepulsivePower();
    }